

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha_test.cc
# Opt level: O3

void __thiscall SHATest_SHA1ABI_Test::TestBody(SHATest_SHA1ABI_Test *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Type_conflict args_2;
  long lVar4;
  int local_a8 [6];
  SHA_CTX ctx;
  
  SHA1_Init((SHA_CTX *)&ctx);
  local_a8[0] = 1;
  local_a8[1] = 2;
  local_a8[2] = 4;
  local_a8[3] = 8;
  uVar1 = OPENSSL_get_ia32cap(2);
  lVar4 = 0;
  do {
    args_2 = (Type_conflict)*(int *)((long)local_a8 + lVar4);
    if ((uVar1 >> 0x1d & 1) != 0) {
      uVar2 = OPENSSL_get_ia32cap(1);
      if ((uVar2 >> 9 & 1) != 0) {
        abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                  ("sha1_block_data_order_hw, ctx.h, kBuf, blocks",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                   ,0x3a,true,sha1_block_data_order_hw,(Type)&ctx,"",args_2);
      }
    }
    if ((uVar1 & 0x128) == 0x128) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_avx2, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x3f,true,sha1_block_data_order_avx2,(Type)&ctx,"",args_2);
    }
    uVar2 = OPENSSL_get_ia32cap(1);
    if ((uVar2 >> 0x1c & 1) != 0) {
      uVar3 = OPENSSL_get_ia32cap(0);
      if ((uVar3 >> 0x1e & 1) != 0) {
        abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                  ("sha1_block_data_order_avx, ctx.h, kBuf, blocks",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                   ,0x44,true,sha1_block_data_order_avx,(Type)&ctx,"",args_2);
      }
    }
    if ((uVar2 >> 9 & 1) != 0) {
      abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
                ("sha1_block_data_order_ssse3, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x49,true,sha1_block_data_order_ssse3,(Type)&ctx,"",args_2);
    }
    abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
              ("sha1_block_data_order_nohw, ctx.h, kBuf, blocks",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
               ,0x52,true,sha1_block_data_order_nohw,(Type)&ctx,"",args_2);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

TEST(SHATest, SHA1ABI) {
  SHA_CTX ctx;
  SHA1_Init(&ctx);

  static const uint8_t kBuf[SHA_CBLOCK * 8] = {0};
  for (size_t blocks : {1, 2, 4, 8}) {
#if defined(SHA1_ASM)
    CHECK_ABI(sha1_block_data_order, ctx.h, kBuf, blocks);
#endif
#if defined(SHA1_ASM_HW)
    if (sha1_hw_capable()) {
      CHECK_ABI(sha1_block_data_order_hw, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_AVX2)
    if (sha1_avx2_capable()) {
      CHECK_ABI(sha1_block_data_order_avx2, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_AVX)
    if (sha1_avx_capable()) {
      CHECK_ABI(sha1_block_data_order_avx, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_SSSE3)
    if (sha1_ssse3_capable()) {
      CHECK_ABI(sha1_block_data_order_ssse3, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_NEON)
    if (CRYPTO_is_NEON_capable()) {
      CHECK_ABI(sha1_block_data_order_neon, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA1_ASM_NOHW)
    CHECK_ABI(sha1_block_data_order_nohw, ctx.h, kBuf, blocks);
#endif
  }
}